

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void jacobi_ss_root(double *x,int order,double alpha,double beta,double *dp2,double *p1,double *b,
                   double *c)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double local_60;
  double p2;
  double *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  iVar2 = 9;
  p2 = (double)c;
  local_50 = b;
  local_48 = beta;
  local_40 = alpha;
  local_38 = r8_epsilon();
  do {
    jacobi_ss_recur(&local_60,dp2,p1,*x,order,local_40,local_48,local_50,(double *)p2);
    dVar1 = *dp2;
    dVar4 = *x - local_60 / dVar1;
    *x = dVar4;
    bVar3 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if (ABS(local_60 / dVar1) <= (ABS(dVar4) + 1.0) * local_38) {
      return;
    }
  } while (bVar3);
  return;
}

Assistant:

void jacobi_ss_root ( double *x, int order, double alpha, double beta, 
  double *dp2, double *p1, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_ROOT improves an approximate root of a Jacobi polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 May 2006
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input/output, double *X, the approximate root, which
//    should be improved on output.
//
//    Input, int ORDER, the order of the polynomial.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.
//
//    Output, double *DP2, the value of J'(ORDER)(X).
//
//    Output, double *P1, the value of J(ORDER-1)(X).
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double d;
  double eps;
  double p2;
  int step;
  int step_max = 10;

  eps = r8_epsilon ( );

  for ( step = 1; step <= step_max; step++ )
  {
    jacobi_ss_recur ( &p2, dp2, p1, *x, order, alpha, beta, b, c );

    d = p2 / ( *dp2 );
    *x = *x - d;

    if ( fabs ( d ) <= eps * ( fabs ( *x ) + 1.0 ) )
    {
      return;
    }
  }
  return;
}